

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicographical_compare_suite.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  compare_null();
  compare_boolean();
  compare_integer();
  compare_real();
  compare_string();
  compare_array_array();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    compare_null();
    compare_boolean();
    compare_integer();
    compare_real();
    compare_string();
    compare_array_array();

    return boost::report_errors();
}